

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMVel.cpp
# Opt level: O3

void __thiscall OpenMD::COMVel::doFrame(COMVel *this,int param_1)

{
  SelectionManager *this_00;
  double *pdVar1;
  double dVar2;
  uint i_1;
  StuntDouble *pSVar3;
  long lVar4;
  int i;
  double local_88;
  int local_7c;
  SelectionSet local_78;
  double local_58 [4];
  double local_38 [4];
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_78,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_78.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_78.bitsets_);
  }
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)OpenMD::V3Zero._16_8_;
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)OpenMD::V3Zero._0_8_;
  local_78.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)OpenMD::V3Zero._8_8_;
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  pSVar3 = SelectionManager::beginSelected(this_00,&local_7c);
  if (pSVar3 == (StuntDouble *)0x0) {
    local_88 = 0.0;
  }
  else {
    local_88 = 0.0;
    do {
      dVar2 = pSVar3->mass_;
      lVar4 = *(long *)((long)&(pSVar3->snapshotMan_->currentSnapshot_->atomData).velocity.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar3->storage_);
      local_38[2] = (double)*(undefined8 *)(lVar4 + 0x10 + (long)pSVar3->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar4 + (long)pSVar3->localIndex_ * 0x18);
      local_38[0] = *pdVar1;
      local_38[1] = pdVar1[1];
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      lVar4 = 0;
      do {
        local_58[lVar4] = local_38[lVar4] * dVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        (&local_78.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar4] =
             (pointer)(local_58[lVar4] +
                      (double)(&local_78.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start)[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_88 = local_88 + dVar2;
      pSVar3 = SelectionManager::nextSelected(this_00,&local_7c);
    } while (pSVar3 != (StuntDouble *)0x0);
  }
  lVar4 = 0;
  do {
    (&local_78.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start)[lVar4] =
         (pointer)((double)(&local_78.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)[lVar4] / local_88);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->values_,(value_type *)&local_78);
  return;
}

Assistant:

void COMVel::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d comVel(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      comVel += sd->getVel() * mass;
    }

    comVel /= mtot;

    values_.push_back(comVel);
  }